

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double *acov,int lag)

{
  size_t sVar1;
  uint uVar2;
  double *x;
  int *ipiv;
  double *A;
  double *b;
  undefined8 *__ptr;
  double *psi;
  undefined8 *__ptr_00;
  void *__ptr_01;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  undefined8 uVar16;
  
  lVar13 = (long)p;
  uVar12 = lVar13 + 1;
  sVar1 = lVar13 * 8 + 8;
  x = (double *)malloc(sVar1);
  ipiv = (int *)malloc(lVar13 * 4 + 4);
  A = (double *)malloc(sVar1 * uVar12);
  b = (double *)malloc(sVar1);
  __ptr = (undefined8 *)malloc(sVar1);
  sVar1 = (long)q * 8 + 8;
  psi = (double *)malloc(sVar1);
  __ptr_00 = (undefined8 *)malloc(sVar1);
  *__ptr = 0xbff0000000000000;
  *__ptr_00 = 0x3ff0000000000000;
  uVar3 = 0;
  uVar14 = 0;
  if (0 < p) {
    uVar14 = (ulong)(uint)p;
  }
  for (; uVar14 != uVar3; uVar3 = uVar3 + 1) {
    __ptr[uVar3 + 1] = phi[uVar3];
  }
  uVar8 = 0;
  uVar3 = 0;
  if (0 < q) {
    uVar3 = (ulong)(uint)q;
  }
  for (; uVar3 != uVar8; uVar8 = uVar8 + 1) {
    __ptr_00[uVar8 + 1] = theta[uVar8];
  }
  uVar2 = q + 1U;
  if (q < p) {
    uVar2 = p;
  }
  __ptr_01 = malloc((long)(int)uVar2 * 8);
  lVar4 = 0;
  pdVar6 = A;
  for (uVar3 = 0; (long)uVar3 <= lVar13; uVar3 = uVar3 + 1) {
    uVar8 = uVar3 & 0xffffffff;
    for (lVar10 = 0; (uVar12 & 0xffffffff) << 3 != lVar10; lVar10 = lVar10 + 8) {
      uVar16 = 0x3ff0000000000000;
      if (lVar4 != lVar10) {
        uVar16 = 0;
      }
      if (uVar3 == 0) {
        uVar16 = 0;
      }
      iVar9 = (int)uVar8;
      uVar11 = (ulong)(uint)-iVar9;
      if (0 < iVar9) {
        uVar11 = uVar8;
      }
      *(undefined8 *)((long)pdVar6 + lVar10) = uVar16;
      A[uVar3 * uVar12 + uVar11] = A[uVar3 * uVar12 + uVar11] - *(double *)((long)__ptr + lVar10);
      uVar8 = (ulong)(iVar9 - 1);
    }
    pdVar6 = pdVar6 + lVar13 + 1;
    lVar4 = lVar4 + 8;
  }
  psiweight(phi,theta,psi,p,q,q + 1U);
  uVar8 = 0;
  puVar5 = __ptr_00;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar8;
  }
  for (; uVar8 != uVar3; uVar8 = uVar8 + 1) {
    dVar15 = 0.0;
    for (lVar4 = 0; lVar4 <= q; lVar4 = lVar4 + 1) {
      if ((int)uVar8 + (int)lVar4 <= q) {
        dVar15 = dVar15 + (double)puVar5[lVar4] * psi[lVar4];
      }
    }
    *(double *)((long)__ptr_01 + uVar8 * 8) = dVar15 * var;
    puVar5 = puVar5 + 1;
  }
  for (lVar4 = 0; lVar4 <= lVar13; lVar4 = lVar4 + 1) {
    b[lVar4] = *(double *)((long)__ptr_01 + lVar4 * 8);
  }
  ludecomp(A,(int)uVar12,ipiv);
  linsolve(A,(int)uVar12,b,ipiv,x);
  for (lVar4 = 0; lVar4 <= lVar13; lVar4 = lVar4 + 1) {
    acov[lVar4] = x[lVar4];
  }
  pdVar6 = acov + lVar13;
  for (; (long)uVar12 < (long)lag; uVar12 = uVar12 + 1) {
    dVar15 = 0.0;
    pdVar7 = phi;
    for (lVar13 = 0; -lVar13 != uVar14; lVar13 = lVar13 + -1) {
      dVar15 = dVar15 + *pdVar7 * pdVar6[lVar13];
      pdVar7 = pdVar7 + 1;
    }
    if ((long)uVar12 < (long)(int)uVar2) {
      dVar15 = dVar15 + *(double *)((long)__ptr_01 + uVar12 * 8);
    }
    acov[uVar12] = dVar15;
    pdVar6 = pdVar6 + 1;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(psi);
  free(x);
  free(A);
  free(ipiv);
  free(b);
  return;
}

Assistant:

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double* acov, int lag) {
	int i,j,t,m;
	double *tcov,*psi,*A,*b,*ph,*th,*thph;
	int *ipiv;
	int p1;
	double temp;
	
	p1 = p+1;
	tcov = (double*) malloc(sizeof(double) * (p1));
	ipiv = (int*) malloc(sizeof(int) * (p1));
	A = (double*) malloc(sizeof(double) * (p1) * (p1));
	b = (double*) malloc(sizeof(double) * (p1));
	ph = (double*) malloc(sizeof(double) * (p1));
	psi = (double*) malloc(sizeof(double) * (q+1));
	th = (double*) malloc(sizeof(double) * (q+1));

	ph[0] = -1.0;
	th[0] = 1.0;
	
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	if (p >= q+1) {
		m = p;
	} else {
		m = q + 1;
	}
	thph = (double*) malloc(sizeof(double) * m);
	// set A
	for(i = 0; i < p1;++i) {
		for(j=0; j < p1;++j) {
			A[i*p1+j] = 0.;
			if (i == j && i != 0) {
				A[i*p1+j] = 1.;
			}

			t = i - j;
			if (t < 0) {
				t = -t;
			} 
			
			A[i*p1+t] -= ph[j];
			
		}
	}
	
	//set b
	
	psiweight(phi,theta,psi,p,q,q+1);
	for(i=0; i < m;++i) {
		
		temp = 0.;
		for(j = 0; j < q+1;++j) {
			if(i+j < q+1) {
				temp += th[i+j] * psi[j];
			}
		}
		thph[i] = temp*var;
		
	}
	
	for(i=0; i < p1;++i) {
		b[i] = thph[i];
	}
	
	ludecomp(A,p1,ipiv);
	linsolve(A,p1,b,ipiv,tcov);
	
	for(i = 0; i < p1;++i) {
		acov[i] = tcov[i];
	}
	
	for(i = p1; i < lag;++i) {
		temp = 0.0;
		for(j = 1; j < p1; ++j) {
			temp+= phi[j-1] * acov[i - j];
		}
		if (i < m) {
			temp += thph[i];
		}
		acov[i] = temp;
	}
	
	free(ph);
	free(th);
	free(thph);
	free(psi);
	free(tcov);
	free(A);
	free(ipiv);
	free(b);
}